

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_or(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  int iVar1;
  uint8_t uVar2;
  roaring_array_t *prVar3;
  byte bVar4;
  roaring_array_t *ra;
  container_t *pcVar5;
  uint16_t *puVar6;
  roaring_bitmap_t *prVar7;
  uint end_index;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint8_t type2;
  uint8_t type1;
  uint8_t result_type;
  uint8_t local_5a;
  uint8_t local_59;
  uint8_t local_58;
  uint8_t local_57;
  ushort local_56;
  uint local_54;
  roaring_array_t *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_57 = '\0';
  uVar10 = (x1->high_low_container).size;
  prVar7 = x2;
  if (uVar10 != 0) {
    uVar12 = (x2->high_low_container).size;
    local_48 = (ulong)uVar12;
    prVar7 = x1;
    if (uVar12 != 0) {
      ra = &roaring_bitmap_create_with_capacity(uVar12 + uVar10)->high_low_container;
      bVar4 = 0;
      if (((x1->high_low_container).flags & 1) != 0) {
        bVar4 = (x2->high_low_container).flags & 1;
      }
      local_54 = 0;
      ra->flags = ra->flags & 0xfe | bVar4;
      uVar8 = *(x1->high_low_container).keys;
      puVar6 = (x2->high_low_container).keys;
      local_38 = (ulong)(uVar10 - 1);
      uVar11 = 0;
      local_50 = &x2->high_low_container;
      local_40 = (ulong)uVar10;
      do {
        local_56 = *puVar6;
        uVar11 = (ulong)(int)uVar11;
        while( true ) {
          prVar3 = local_50;
          uVar10 = local_54;
          iVar9 = (int)uVar11;
          if (uVar8 == local_56) break;
          if (local_56 <= uVar8) {
            local_5a = local_50->typecodes[local_54 & 0xffff];
            pcVar5 = get_copy_of_container
                               (local_50->containers[local_54 & 0xffff],&local_5a,
                                (_Bool)(local_50->flags & 1));
            if ((prVar3->flags & 1) != 0) {
              if (((roaring_array_t *)&prVar3->size)->size <= (int)uVar10) goto LAB_00116aba;
              prVar3->containers[(int)uVar10] = pcVar5;
              prVar3->typecodes[(int)uVar10] = local_5a;
            }
            local_58 = local_5a;
            extend_array(ra,1);
            iVar9 = ra->size;
            ra->keys[iVar9] = local_56;
            ra->containers[iVar9] = pcVar5;
            ra->typecodes[iVar9] = local_58;
            ra->size = ra->size + 1;
            uVar12 = (uint)local_48;
            end_index = uVar12;
            if (uVar10 + 1 != uVar12) goto LAB_00116a2a;
            goto LAB_00116a8e;
          }
          local_59 = (x1->high_low_container).typecodes[uVar11 & 0xffff];
          pcVar5 = get_copy_of_container
                             ((x1->high_low_container).containers[uVar11 & 0xffff],&local_59,
                              (_Bool)((x1->high_low_container).flags & 1));
          uVar2 = local_59;
          if (((x1->high_low_container).flags & 1) != 0) {
            if ((x1->high_low_container).size <= iVar9) {
LAB_00116aba:
              __assert_fail("i < ra->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1a3a,
                            "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                           );
            }
            (x1->high_low_container).containers[uVar11] = pcVar5;
            (x1->high_low_container).typecodes[uVar11] = local_59;
          }
          extend_array(ra,1);
          iVar1 = ra->size;
          ra->keys[iVar1] = uVar8;
          ra->containers[iVar1] = pcVar5;
          ra->typecodes[iVar1] = uVar2;
          ra->size = ra->size + 1;
          if ((int)local_38 == iVar9) {
            end_index = (uint)local_48;
            uVar12 = local_54;
            goto LAB_00116a44;
          }
          uVar11 = uVar11 + 1;
          uVar8 = (x1->high_low_container).keys[uVar11 & 0xffff];
        }
        local_59 = (x1->high_low_container).typecodes[uVar11 & 0xffff];
        local_5a = local_50->typecodes[local_54 & 0xffff];
        pcVar5 = container_or((x1->high_low_container).containers[uVar11 & 0xffff],local_59,
                              local_50->containers[local_54 & 0xffff],local_5a,&local_57);
        local_56 = CONCAT11(local_56._1_1_,local_57);
        extend_array(ra,1);
        iVar1 = ra->size;
        ra->keys[iVar1] = uVar8;
        ra->containers[iVar1] = pcVar5;
        ra->typecodes[iVar1] = (uint8_t)local_56;
        ra->size = ra->size + 1;
        uVar12 = uVar10 + 1;
        if (((int)local_38 == iVar9) || (uVar12 == (uint)local_48)) {
          uVar11 = (ulong)(iVar9 + 1);
          end_index = (uint)local_48;
LAB_00116a8e:
          uVar10 = (uint)uVar11;
          if (uVar10 == (uint)local_40) {
LAB_00116a44:
            local_54 = uVar12;
            bVar4 = local_50->flags;
            x1 = (roaring_bitmap_t *)local_50;
            uVar10 = local_54;
          }
          else {
            if (uVar12 != end_index) {
              return (roaring_bitmap_t *)ra;
            }
            bVar4 = (x1->high_low_container).flags;
            end_index = (uint)local_40;
          }
          ra_append_copy_range(ra,&x1->high_low_container,uVar10,end_index,(_Bool)(bVar4 & 1));
          return (roaring_bitmap_t *)ra;
        }
        uVar11 = uVar11 + 1;
        uVar8 = (x1->high_low_container).keys[(uint)uVar11 & 0xffff];
LAB_00116a2a:
        local_54 = uVar10 + 1;
        puVar6 = (uint16_t *)((ulong)((local_54 & 0xffff) * 2) + (long)local_50->keys);
      } while( true );
    }
  }
  prVar7 = roaring_bitmap_copy(prVar7);
  return prVar7;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_or(const roaring_bitmap_t *x1,
                                    const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) && is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            container_t *c = container_or(c1, type1, c2, type2, &result_type);

            // since we assume that the initial containers are non-empty, the
            // result here
            // can only be non-empty
            ra_append(&answer->high_low_container, s1, c, result_type);
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            // c1 = container_clone(c1, type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            // c2 = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}